

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFuncType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  Module *this_00;
  pointer pFVar1;
  pointer pTVar2;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_70;
  unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> local_68;
  __single_object func_type;
  undefined1 local_40 [8];
  __single_object field;
  Type *result_types_local;
  Index result_count_local;
  Type *param_types_local;
  Index param_count_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
          )result_types;
  GetLocation((Location *)&func_type,this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_40);
  std::make_unique<wabt::FuncType>();
  pFVar1 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                     (&local_68);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::assign<wabt::Type*,void>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&pFVar1->sig,param_types,
             param_types + param_count);
  pFVar1 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                     (&local_68);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::assign<wabt::Type*,void>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&(pFVar1->sig).result_types,
             (Type *)field._M_t.
                     super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                     .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl,
             (Type *)((long)field._M_t.
                            super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                            .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                     (ulong)result_count * 8));
  pTVar2 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
           operator->((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)local_40);
  std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
            ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)&pTVar2->type,
             &local_68);
  this_00 = this->module_;
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::unique_ptr
            (&local_70,
             (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
             local_40);
  Module::AppendField(this_00,&local_70);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            (&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::~unique_ptr(&local_68);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            ((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
             local_40);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnFuncType(Index index,
                                  Index param_count,
                                  Type* param_types,
                                  Index result_count,
                                  Type* result_types) {
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto func_type = std::make_unique<FuncType>();
  func_type->sig.param_types.assign(param_types, param_types + param_count);
  func_type->sig.result_types.assign(result_types, result_types + result_count);
  field->type = std::move(func_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}